

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cc
# Opt level: O0

void __thiscall OverlaySpace::restoreXml(OverlaySpace *this,Element *el)

{
  long lVar1;
  Element *pEVar2;
  bool bVar3;
  _Ios_Fmtflags _Var4;
  uint4 uVar5;
  int4 iVar6;
  string *psVar7;
  AddrSpaceManager *this_00;
  AddrSpace *pAVar8;
  LowlevelError *this_01;
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  string local_218 [8];
  string basename;
  allocator local_1f1;
  string local_1f0 [32];
  long local_1d0;
  istringstream s1;
  allocator local_39;
  string local_38 [32];
  Element *local_18;
  Element *el_local;
  OverlaySpace *this_local;
  
  local_18 = el;
  el_local = (Element *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"name",&local_39);
  psVar7 = Element::getAttributeValue(el,(string *)local_38);
  std::__cxx11::string::operator=((string *)&(this->super_AddrSpace).name,(string *)psVar7);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pEVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"index",&local_1f1);
  psVar7 = Element::getAttributeValue(pEVar2,(string *)local_1f0);
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1d0,psVar7,8);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  lVar1 = *(long *)(local_1d0 + -0x18);
  _Var4 = std::operator|(_S_dec,_S_hex);
  _Var4 = std::operator|(_Var4,_S_oct);
  std::ios_base::unsetf((ios_base *)((long)&local_1d0 + lVar1),_Var4);
  std::istream::operator>>(&local_1d0,&(this->super_AddrSpace).index);
  pEVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"base",&local_239);
  psVar7 = Element::getAttributeValue(pEVar2,(string *)local_238);
  std::__cxx11::string::string(local_218,(string *)psVar7);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  this_00 = AddrSpace::getManager(&this->super_AddrSpace);
  pAVar8 = AddrSpaceManager::getSpaceByName(this_00,(string *)local_218);
  this->baseSpace = pAVar8;
  if (this->baseSpace != (AddrSpace *)0x0) {
    uVar5 = AddrSpace::getAddrSize(this->baseSpace);
    (this->super_AddrSpace).addressSize = uVar5;
    uVar5 = AddrSpace::getWordSize(this->baseSpace);
    (this->super_AddrSpace).wordsize = uVar5;
    iVar6 = AddrSpace::getDelay(this->baseSpace);
    (this->super_AddrSpace).delay = iVar6;
    iVar6 = AddrSpace::getDeadcodeDelay(this->baseSpace);
    (this->super_AddrSpace).deadcodedelay = iVar6;
    AddrSpace::calcScaleMask(&this->super_AddrSpace);
    bVar3 = AddrSpace::isBigEndian(this->baseSpace);
    if (bVar3) {
      AddrSpace::setFlags(&this->super_AddrSpace,1);
    }
    bVar3 = AddrSpace::hasPhysical(this->baseSpace);
    if (bVar3) {
      AddrSpace::setFlags(&this->super_AddrSpace,0x100);
    }
    std::__cxx11::string::~string(local_218);
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1d0);
    return;
  }
  this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+((char *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Base space does not exist for overlay space: ");
  LowlevelError::LowlevelError(this_01,local_260);
  __cxa_throw(this_01,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void OverlaySpace::restoreXml(const Element *el)

{
  name = el->getAttributeValue("name");
  istringstream s1(el->getAttributeValue("index"));
  s1.unsetf(ios::dec | ios::hex | ios::oct);
  s1 >> index;
  
  string basename = el->getAttributeValue("base");
  baseSpace = getManager()->getSpaceByName(basename);
  if (baseSpace == (AddrSpace *)0)
    throw LowlevelError("Base space does not exist for overlay space: "+name);
  addressSize = baseSpace->getAddrSize();
  wordsize = baseSpace->getWordSize();
  delay = baseSpace->getDelay();
  deadcodedelay = baseSpace->getDeadcodeDelay();
  calcScaleMask();

  if (baseSpace->isBigEndian())
    setFlags(big_endian);
  if (baseSpace->hasPhysical())
    setFlags(hasphysical);
}